

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::BuiltinVariableShader::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,BuiltinVariableShader *this,ContextType *contextType,
          VariableTest test)

{
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream buf;
  VariableTest test_local;
  ContextType *contextType_local;
  BuiltinVariableShader *this_local;
  
  buf._372_4_ = test;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"${GLSL_VERSION_DECL}\nin highp vec4 a_position;\n");
  if (buf._372_4_ == 0) {
    std::operator<<((ostream *)local_1a0,"in highp vec4 a_pointSize;\n");
  }
  else if (buf._372_4_ == 2) {
    std::operator<<((ostream *)local_1a0,"in highp vec4 a_primitiveID;\n");
  }
  if (buf._372_4_ == 0) {
    std::operator<<((ostream *)local_1a0,"out highp vec4 v_geom_pointSize;\n");
  }
  else if (buf._372_4_ == 2) {
    std::operator<<((ostream *)local_1a0,"out highp vec4 v_geom_primitiveID;\n");
  }
  std::operator<<((ostream *)local_1a0,
                  "void main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n");
  if (buf._372_4_ == 0) {
    std::operator<<((ostream *)local_1a0,"\tv_geom_pointSize = a_pointSize;\n");
  }
  else if (buf._372_4_ == 2) {
    std::operator<<((ostream *)local_1a0,"\tv_geom_primitiveID = a_primitiveID;\n");
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_1d0,contextType);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string BuiltinVariableShader::genVertexSource (const glu::ContextType& contextType, VariableTest test) const
{
	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in highp vec4 a_position;\n";

	if (test == TEST_POINT_SIZE)
		buf << "in highp vec4 a_pointSize;\n";
	else if (test == TEST_PRIMITIVE_ID)
		buf << "in highp vec4 a_primitiveID;\n";

	if (test == TEST_POINT_SIZE)
		buf << "out highp vec4 v_geom_pointSize;\n";
	else if (test == TEST_PRIMITIVE_ID)
		buf << "out highp vec4 v_geom_primitiveID;\n";

	buf <<	"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"	gl_PointSize = 1.0;\n";

	if (test == TEST_POINT_SIZE)
		buf << "	v_geom_pointSize = a_pointSize;\n";
	else if (test == TEST_PRIMITIVE_ID)
		buf << "	v_geom_primitiveID = a_primitiveID;\n";

	buf <<	"}\n";

	return specializeShader(buf.str(), contextType);
}